

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

Vec_Int_t * Saig_ManComputeSwitchProbs(Aig_Man_t *pAig,int nFrames,int nPref,int fProbOne)

{
  int iVar1;
  Gia_Man_t *pGia;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  void *pvVar2;
  int local_44;
  int i;
  Aig_Obj_t *pObj;
  Gia_Man_t *p;
  Vec_Int_t *vResult;
  Vec_Int_t *vSwitching;
  int fProbOne_local;
  int nPref_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  pGia = Gia_ManFromAigSwitch(pAig);
  p_00 = Gia_ManComputeSwitchProbs(pGia,nFrames,nPref,fProbOne);
  iVar1 = Aig_ManObjNumMax(pAig);
  p_01 = Vec_IntStart(iVar1);
  for (local_44 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vObjs,local_44);
    if (pvVar2 != (void *)0x0) {
      iVar1 = Abc_Lit2Var(*(int *)((long)pvVar2 + 0x28));
      iVar1 = Vec_IntEntry(p_00,iVar1);
      Vec_IntWriteEntry(p_01,local_44,iVar1);
    }
  }
  Vec_IntFree(p_00);
  Gia_ManStop(pGia);
  return p_01;
}

Assistant:

Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * pAig, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching, * vResult;
    Gia_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // translate AIG into the intermediate form (takes care of choices if present!)
    p = Gia_ManFromAigSwitch( pAig );
    // perform the computation of switching activity
    vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    // transfer the computed result to the original AIG
    vResult = Vec_IntStart( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( Aig_ObjIsCo(pObj) )
//            printf( "%d=%f\n", i, Abc_Int2Float( Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) ) );
        Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) );
    }
    // delete intermediate results
    Vec_IntFree( vSwitching );
    Gia_ManStop( p );
    return vResult;
}